

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O3

void nk_glfw3_mouse_button_callback(GLFWwindow *win,int button,int action,int mods)

{
  void *pvVar1;
  double dVar2;
  double y;
  double x;
  double local_28;
  double local_20;
  
  if (button != 0) {
    return;
  }
  pvVar1 = glfwGetWindowUserPointer(win);
  glfwGetCursorPos(win,&local_20,&local_28);
  if (action == 1) {
    dVar2 = glfwGetTime();
    dVar2 = dVar2 - *(double *)((long)pvVar1 + 0x4768);
    if ((0.02 < dVar2) && (dVar2 < 0.2)) {
      *(undefined4 *)((long)pvVar1 + 0x4770) = 1;
      *(ulong *)((long)pvVar1 + 0x4774) = CONCAT44((float)local_28,(float)local_20);
    }
    dVar2 = glfwGetTime();
    *(double *)((long)pvVar1 + 0x4768) = dVar2;
  }
  else {
    *(undefined4 *)((long)pvVar1 + 0x4770) = 0;
  }
  return;
}

Assistant:

NK_API void
nk_glfw3_mouse_button_callback(GLFWwindow* win, int button, int action, int mods)
{
    double x, y;
    if (button != GLFW_MOUSE_BUTTON_LEFT) return;
    struct nk_glfw* glfw = glfwGetWindowUserPointer(win);
    glfwGetCursorPos(win, &x, &y);
    if (action == GLFW_PRESS)  {
        double dt = glfwGetTime() - glfw->last_button_click;
        if (dt > NK_GLFW_DOUBLE_CLICK_LO && dt < NK_GLFW_DOUBLE_CLICK_HI) {
            glfw->is_double_click_down = nk_true;
            glfw->double_click_pos = nk_vec2((float)x, (float)y);
        }
        glfw->last_button_click = glfwGetTime();
    } else glfw->is_double_click_down = nk_false;
}